

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ieee.h
# Opt level: O3

DiyFp __thiscall FIX::double_conversion::Double::AsDiyFp(Double *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t d64;
  ulong uVar4;
  DiyFp DVar5;
  
  uVar1 = this->d64_;
  if ((long)uVar1 < 0) {
    __assert_fail("Sign() > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/ieee.h"
                  ,0x3c,"DiyFp FIX::double_conversion::Double::AsDiyFp() const");
  }
  uVar2 = uVar1 & 0x7ff0000000000000;
  if (uVar2 != 0x7ff0000000000000) {
    uVar3 = (uVar1 & 0xfffffffffffff) + 0x10000000000000;
    if (uVar2 == 0) {
      uVar3 = uVar1 & 0xfffffffffffff;
    }
    uVar4 = 0xfffffbce;
    if (uVar2 != 0) {
      uVar4 = (ulong)((uint)(uVar1 >> 0x34) - 0x433);
    }
    DVar5._8_8_ = uVar4;
    DVar5.f_ = uVar3;
    return DVar5;
  }
  __assert_fail("!IsSpecial()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/ieee.h"
                ,0x3d,"DiyFp FIX::double_conversion::Double::AsDiyFp() const");
}

Assistant:

DiyFp AsDiyFp() const {
    ASSERT(Sign() > 0);
    ASSERT(!IsSpecial());
    return DiyFp(Significand(), Exponent());
  }